

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluk.c
# Opt level: O2

int ffuintfi4(uint *input,long ntodo,double scale,double zero,int *output,int *status)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 2147483648.0)) || (NAN(zero))) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        dVar5 = ((double)input[lVar2] - zero) / scale;
        if (-2147483648.49 <= dVar5) {
          if (dVar5 <= 2147483647.49) {
            if (0.0 <= dVar5) {
              dVar5 = dVar5 + 0.5;
            }
            else {
              dVar5 = dVar5 + -0.5;
            }
            iVar4 = (int)dVar5;
          }
          else {
            *status = -0xb;
            iVar4 = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          iVar4 = -0x80000000;
        }
        output[lVar2] = iVar4;
      }
    }
    else {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        uVar3 = input[lVar2];
        if ((int)uVar3 < 0) {
          *status = -0xb;
          uVar3 = 0x7fffffff;
        }
        output[lVar2] = uVar3;
      }
    }
  }
  else {
    lVar1 = 0;
    if (ntodo < 1) {
      ntodo = lVar1;
    }
    for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
      output[lVar1] = input[lVar1] ^ 0x80000000;
    }
  }
  return *status;
}

Assistant:

int ffuintfi4(unsigned int *input,  /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,  /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 2147483648.)
    {       
        /* Instead of subtracting 2147483648, it is more efficient */
        /* to just flip the sign bit with the XOR operator */

        for (ii = 0; ii < ntodo; ii++)
             output[ii] =  ( *(int *) &input[ii] ) ^ 0x80000000;
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > INT32_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
                output[ii] = input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}